

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O2

void skiwi::format_test_6(void)

{
  format_options ops;
  string res;
  allocator<char> local_475;
  format_options local_474 [4];
  undefined4 local_470;
  allocator<char> local_468 [32];
  string local_448 [32];
  anon_unknown_0 local_428 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string local_3e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  string local_3a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_368 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string local_2e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28 [32];
  
  skiwi::format_options::format_options(local_474);
  local_470 = 10;
  std::__cxx11::string::string<std::allocator<char>>
            (local_448,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             local_468);
  skiwi::format(local_28,(format_options *)local_448);
  anon_unknown_0::cleanup(local_428,(EVP_PKEY_CTX *)local_28);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,
             "\n(define append\n  (lambda (l m)\n          (if (null? l)\n              m\n              (cons\n                (car l)\n                (append\n                  (cdr l) m)))))\n"
             ,(allocator<char> *)local_448);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_48,(EVP_PKEY_CTX *)local_68);
  std::__cxx11::string::string((string *)&local_88,(string *)local_428);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_48,&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x92,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string(local_68);
  local_470 = 0x14;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_468,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_475);
  skiwi::format(local_a8,(format_options *)local_468);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_448,(EVP_PKEY_CTX *)local_a8);
  std::__cxx11::string::operator=((string *)local_428,local_448);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,
             "\n(define append (lambda\n                 (l m)\n                 (if (null? l)\n                     m\n                     (cons\n                       (car l)\n                       (append\n                         (cdr l) m)))))\n"
             ,(allocator<char> *)local_448);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_c8,(EVP_PKEY_CTX *)local_e8);
  std::__cxx11::string::string((string *)&local_108,(string *)local_428);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_c8,&local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x9f,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string(local_e8);
  local_470 = 0x1e;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_468,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_475);
  skiwi::format(local_128,(format_options *)local_468);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_448,(EVP_PKEY_CTX *)local_128);
  std::__cxx11::string::operator=((string *)local_428,local_448);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,
             "\n(define append (lambda (l m)\n                       (if (null? l)\n                           m (cons\n                               (car l)\n                               (append\n                                 (cdr l) m)))))\n"
             ,(allocator<char> *)local_448);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_148,(EVP_PKEY_CTX *)local_168);
  std::__cxx11::string::string((string *)&local_188,(string *)local_428);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_148,&local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xaa,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string(local_168);
  local_470 = 0x28;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_468,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_475);
  skiwi::format(local_1a8,(format_options *)local_468);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_448,(EVP_PKEY_CTX *)local_1a8);
  std::__cxx11::string::operator=((string *)local_428,local_448);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,
             "\n(define append (lambda (l m)\n                       (if (null? l) m (cons\n                                         (car l)\n                                         (append\n                                           (cdr l) m)))))\n"
             ,(allocator<char> *)local_448);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_1c8,(EVP_PKEY_CTX *)local_1e8);
  std::__cxx11::string::string((string *)&local_208,(string *)local_428);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_1c8,&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xb4,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string(local_1e8);
  local_470 = 0x32;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_468,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_475);
  skiwi::format(local_228,(format_options *)local_468);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_448,(EVP_PKEY_CTX *)local_228);
  std::__cxx11::string::operator=((string *)local_428,local_448);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            (local_268,
             "\n(define append (lambda (l m)\n                       (if (null? l) m (cons (car l)\n                                             (append\n                                               (cdr l) m)))))\n"
             ,(allocator<char> *)local_448);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_248,(EVP_PKEY_CTX *)local_268);
  std::__cxx11::string::string((string *)&local_288,(string *)local_428);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_248,&local_288,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xbd,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string(local_268);
  local_470 = 0x3c;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_468,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_475);
  skiwi::format(local_2a8,(format_options *)local_468);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_448,(EVP_PKEY_CTX *)local_2a8);
  std::__cxx11::string::operator=((string *)local_428,local_448);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e8,
             "\n(define append (lambda (l m) (if (null? l) m (cons (car l)\n                                                   (append (cdr l)\n                                                           m)))))\n"
             ,(allocator<char> *)local_448);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_2c8,(EVP_PKEY_CTX *)local_2e8);
  std::__cxx11::string::string((string *)&local_308,(string *)local_428);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_2c8,&local_308,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xc5,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string(local_2e8);
  local_470 = 0x46;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_468,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_475);
  skiwi::format(local_328,(format_options *)local_468);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_448,(EVP_PKEY_CTX *)local_328);
  std::__cxx11::string::operator=((string *)local_428,local_448);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            (local_368,
             "\n(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l)\n                                                                   m)))))\n"
             ,(allocator<char> *)local_448);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_348,(EVP_PKEY_CTX *)local_368);
  std::__cxx11::string::string((string *)&local_388,(string *)local_428);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_348,&local_388,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xcc,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string(local_368);
  local_470 = 0x50;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_468,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_475);
  skiwi::format(local_3a8,(format_options *)local_468);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_448,(EVP_PKEY_CTX *)local_3a8);
  std::__cxx11::string::operator=((string *)local_428,local_448);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3e8,
             "\n(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l) m)))))\n"
             ,(allocator<char> *)local_448);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_3c8,(EVP_PKEY_CTX *)local_3e8);
  std::__cxx11::string::string((string *)&local_408,(string *)local_428);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_3c8,&local_408,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xd2,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string(local_3e8);
  std::__cxx11::string::~string((string *)local_428);
  return;
}

Assistant:

void format_test_6()
  {
  format_options ops;
  ops.max_width = 10;
  auto res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append
  (lambda (l m)
          (if (null? l)
              m
              (cons
                (car l)
                (append
                  (cdr l) m)))))
)"), res);

  ops.max_width = 20;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda
                 (l m)
                 (if (null? l)
                     m
                     (cons
                       (car l)
                       (append
                         (cdr l) m)))))
)"), res);

  ops.max_width = 30;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m)
                       (if (null? l)
                           m (cons
                               (car l)
                               (append
                                 (cdr l) m)))))
)"), res);

  ops.max_width = 40;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m)
                       (if (null? l) m (cons
                                         (car l)
                                         (append
                                           (cdr l) m)))))
)"), res);

  ops.max_width = 50;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m)
                       (if (null? l) m (cons (car l)
                                             (append
                                               (cdr l) m)))))
)"), res);

  ops.max_width = 60;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m) (if (null? l) m (cons (car l)
                                                   (append (cdr l)
                                                           m)))))
)"), res);

  ops.max_width = 70;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l)
                                                                   m)))))
)"), res);

  ops.max_width = 80;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l) m)))))
)"), res);
  }